

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

shared_ptr<QPDFObject> __thiscall QPDF::getObjectForJSON(QPDF *this,int id,int gen)

{
  pointer pMVar1;
  pointer ppVar2;
  size_type sVar3;
  int in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar4;
  shared_ptr<QPDFObject> sVar5;
  undefined1 local_70 [24];
  shared_ptr<QPDFObject> *obj;
  type_conflict2 *inserted;
  type *it;
  __index_type local_40;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> local_38;
  QPDFObjGen local_28;
  QPDFObjGen og;
  int gen_local;
  int id_local;
  QPDF *this_local;
  
  this_00 = (unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
            CONCAT44(in_register_00000034,id);
  og.gen = gen;
  QPDFObjGen::QPDFObjGen(&local_28,gen,in_ECX);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(this_00);
  pVar4 = std::
          map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::try_emplace<>(&pMVar1->obj_cache,&local_28);
  it = (type *)pVar4.first._M_node;
  local_40 = pVar4.second;
  local_38.first._M_node = (_Base_ptr)it;
  local_38.second = (bool)local_40;
  inserted = (type_conflict2 *)
             std::get<0ul,std::_Rb_tree_iterator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,bool>
                       (&local_38);
  obj = (shared_ptr<QPDFObject> *)
        std::get<1ul,std::_Rb_tree_iterator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,bool>
                  (&local_38);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> *)inserted);
  local_70._16_8_ = &ppVar2->second;
  if (((ulong)(obj->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr & 1) == 0)
  goto LAB_0038ab1e;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(this_00);
  if ((pMVar1->parsed & 1U) == 0) {
LAB_0038aaec:
    QPDFObject::create<QPDF_Unresolved>((QPDFObject *)local_70,(QPDF *)this_00,local_28);
  }
  else {
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (this_00);
    sVar3 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count(&pMVar1->xref_table,&local_28);
    if (sVar3 != 0) goto LAB_0038aaec;
    QPDFObject::create<QPDF_Null>((QPDFObject *)local_70,(QPDF *)this_00,local_28);
  }
  std::shared_ptr<QPDFObject>::operator=
            ((shared_ptr<QPDFObject> *)local_70._16_8_,(shared_ptr<QPDFObject> *)local_70);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_70);
LAB_0038ab1e:
  std::shared_ptr<QPDFObject>::shared_ptr
            ((shared_ptr<QPDFObject> *)this,(shared_ptr<QPDFObject> *)local_70._16_8_);
  sVar5.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar5.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF::getObjectForJSON(int id, int gen)
{
    auto og = QPDFObjGen(id, gen);
    auto [it, inserted] = m->obj_cache.try_emplace(og);
    auto& obj = it->second.object;
    if (inserted) {
        obj = (m->parsed && !m->xref_table.count(og))
            ? QPDFObject::create<QPDF_Null>(this, og)
            : QPDFObject::create<QPDF_Unresolved>(this, og);
    }
    return obj;
}